

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_seti(lua_State *L,int idx,lua_Integer n)

{
  StkId pTVar1;
  TValue *key;
  int iVar2;
  undefined4 uVar3;
  TValue *t;
  TValue *slot;
  long lVar4;
  
  t = index2addr(L,idx);
  if (t->tt_ == 0x45) {
    slot = luaH_getint((Table *)(t->value_).gc,n);
    if (slot->tt_ != 0) {
      if ((((L->top[-1].tt_ & 0x40) != 0) && ((((Table *)(t->value_).gc)->marked & 4) != 0)) &&
         (((L->top[-1].value_.gc)->marked & 3) != 0)) {
        luaC_barrierback_(L,(Table *)(t->value_).gc);
      }
      pTVar1 = L->top;
      iVar2 = pTVar1[-1].tt_;
      uVar3 = *(undefined4 *)&pTVar1[-1].field_0xc;
      slot->value_ = pTVar1[-1].value_;
      slot->tt_ = iVar2;
      *(undefined4 *)&slot->field_0xc = uVar3;
      lVar4 = -0x10;
      goto LAB_00105755;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  pTVar1 = L->top;
  (pTVar1->value_).i = n;
  pTVar1->tt_ = 0x13;
  key = L->top;
  L->top = key + 1;
  luaV_finishset(L,t,key,key + -1,slot);
  lVar4 = -0x20;
LAB_00105755:
  L->top = (StkId)((long)&L->top->value_ + lVar4);
  return;
}

Assistant:

LUA_API void lua_seti (lua_State *L, int idx, lua_Integer n) {
  StkId t;
  const TValue *slot;
  lua_lock(L);
  api_checknelems(L, 1);
  t = index2addr(L, idx);
  if (luaV_fastset(L, t, n, slot, luaH_getint, L->top - 1))
    L->top--;  /* pop value */
  else {
    setivalue(L->top, n);
    api_incr_top(L);
    luaV_finishset(L, t, L->top - 1, L->top - 2, slot);
    L->top -= 2;  /* pop value and key */
  }
  lua_unlock(L);
}